

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O0

char * __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Push<UnifiedRegex::ResumeCont>
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this)

{
  size_t sVar1;
  VariableElement *this_00;
  char *pcVar2;
  VariableElement *element;
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *local_10;
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this_local;
  
  local_10 = this;
  TemplateParameter::SameOrDerivedFrom<UnifiedRegex::ResumeCont,_UnifiedRegex::Cont>::
  SameOrDerivedFrom((SameOrDerivedFrom<UnifiedRegex::ResumeCont,_UnifiedRegex::Cont> *)
                    ((long)&element + 7));
  sVar1 = VariableElement::Size<UnifiedRegex::ResumeCont>();
  this_00 = (VariableElement *)
            ContinuousPageStack<1UL>::Push(&this->super_ContinuousPageStack<1UL>,sVar1);
  VariableElement::VariableElement(this_00,this->topElementSize);
  sVar1 = VariableElement::Size<UnifiedRegex::ResumeCont>();
  this->topElementSize = sVar1;
  pcVar2 = VariableElement::Data(this_00);
  return pcVar2;
}

Assistant:

inline char* ContinuousPageStackOfVariableElements<T, InitialPageCount>::Push()
{
    TemplateParameter::SameOrDerivedFrom<ActualT, T>(); // ActualT must be the same type as, or a type derived from, T
    VariableElement *const element =
        new(ContinuousPageStack<InitialPageCount>::Push(VariableElement::template
        Size<ActualT>())) VariableElement(topElementSize);
    topElementSize = VariableElement::template Size<ActualT>();
    return element->Data();
}